

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::Logger(Logger *this,Logger *logger)

{
  Logger *logger_local;
  Logger *this_local;
  
  el::base::threading::ThreadSafe::ThreadSafe(&this->super_ThreadSafe);
  Loggable::Loggable(&this->super_Loggable);
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0015f480;
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Logger_0015f4c0;
  std::__cxx11::string::string((string *)&this->m_id);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_stream);
  std::__cxx11::string::string((string *)&this->m_parentApplicationName);
  Configurations::Configurations(&this->m_configurations);
  el::base::utils::std::
  unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::unordered_map(&this->m_unflushedCount);
  el::base::utils::std::shared_ptr<el::LogBuilder>::shared_ptr
            ((shared_ptr<el::LogBuilder> *)&this->m_logBuilder);
  el::base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
  std::__cxx11::string::operator=((string *)&this->m_id,(string *)&logger->m_id);
  this->m_typedConfigurations = logger->m_typedConfigurations;
  std::__cxx11::string::operator=
            ((string *)&this->m_parentApplicationName,(string *)&logger->m_parentApplicationName);
  this->m_isConfigured = (bool)(logger->m_isConfigured & 1);
  Configurations::operator=(&this->m_configurations,&logger->m_configurations);
  el::base::utils::std::
  unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::operator=(&this->m_unflushedCount,&logger->m_unflushedCount);
  this->m_logStreamsReference = logger->m_logStreamsReference;
  return;
}

Assistant:

Logger::Logger(const Logger& logger) {
  base::utils::safeDelete(m_typedConfigurations);
  m_id = logger.m_id;
  m_typedConfigurations = logger.m_typedConfigurations;
  m_parentApplicationName = logger.m_parentApplicationName;
  m_isConfigured = logger.m_isConfigured;
  m_configurations = logger.m_configurations;
  m_unflushedCount = logger.m_unflushedCount;
  m_logStreamsReference = logger.m_logStreamsReference;
}